

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

Vector3d * __thiscall VehicleState::Propagator::GetAccelVector(Propagator *this)

{
  Vector3d *in_RDI;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_00;
  __type _Var1;
  double dVar2;
  double R;
  Vector3d pos;
  double mu;
  Vector3d *accel;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffff70;
  StorageBaseType *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffff70,
             (Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (in_stack_ffffffffffffff70,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
            );
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
            std::pow<double,int>((double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (this_00,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  _Var1 = std::pow<double,int>((double)this_00,in_stack_ffffffffffffff6c);
  dVar2 = (double)this_00 + _Var1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            (this_00,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  _Var1 = std::pow<double,int>((double)this_00,in_stack_ffffffffffffff6c);
  sqrt(dVar2 + _Var1);
  std::pow<double,int>((double)this_00,in_stack_ffffffffffffff6c);
  Eigen::operator*(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  return in_RDI;
}

Assistant:

Eigen::Vector3d Propagator::GetAccelVector(){

		//extract locals
		double mu = this->mu_;
		Eigen::Vector3d pos = this->pos_;

		//radius
		double R = sqrt(pow(pos[0],2) + pow(pos[1],2) + pow(pos[2],2));

		//create accel vector
		Eigen::Vector3d accel = -1.0*mu/pow(R,3)*pos;

		//return
		return accel;


	}